

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O0

void __thiscall pstore::broker::gc_watch_thread::stop(gc_watch_thread *this,int signum)

{
  double __x;
  not_null<const_char_*> local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  int signum_local;
  gc_watch_thread *this_local;
  
  lock._12_4_ = signum;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mut_);
  this->done_ = true;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  gsl::not_null<const_char_*>::not_null(&local_30,"asking gc process watch thread to exit");
  pstore::log((pstore *)0x6,__x);
  signal_cv::notify_all(&this->cv_,lock._12_4_);
  return;
}

Assistant:

void gc_watch_thread::stop (int const signum) {
            {
                std::unique_lock<decltype (mut_)> const lock{mut_};
                done_ = true;
            }
            log (priority::info, "asking gc process watch thread to exit");
            cv_.notify_all (signum);
        }